

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexTriangleFilter::buildKernel
          (PtexTriangleFilter *this,PtexTriangleKernel *k,float u,float v,float uw1,float vw1,
          float uw2,float vw2,float width,float blur,Res faceRes)

{
  int iVar1;
  PtexTriangleKernel *in_RSI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float w;
  float ww;
  float vw;
  float uw;
  float scale;
  int reslog2;
  float m;
  float b;
  float b_b;
  float b_t;
  float b_e;
  float X;
  float eccRatio;
  float maxEcc;
  float Cc;
  float Bc;
  float Ac;
  float C;
  float B;
  float A;
  float scaleB;
  float scaleAC;
  float sqrt3;
  Res local_96;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  undefined4 local_84;
  int local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  undefined4 local_64;
  undefined4 local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  undefined4 local_3c;
  float local_38;
  float local_20;
  float local_1c;
  PtexTriangleKernel *local_18;
  Res local_2;
  
  local_3c = 0x3fddb3d7;
  local_40 = in_XMM6_Da * 0.25 * in_XMM6_Da;
  local_44 = local_40 * -2.0;
  local_48 = (in_XMM3_Da * in_XMM3_Da + in_XMM5_Da * in_XMM5_Da) * local_40;
  local_4c = (in_XMM2_Da * in_XMM3_Da + in_XMM4_Da * in_XMM5_Da) * local_44;
  local_50 = (in_XMM2_Da * in_XMM2_Da + in_XMM4_Da * in_XMM4_Da) * local_40;
  local_54 = local_48 * 0.75;
  local_58 = (local_4c - local_48) * 0.8660254;
  local_5c = local_48 * 0.25 + -(local_4c * 0.5) + local_50;
  local_60 = 0x41700000;
  local_64 = 0x3f812492;
  local_38 = in_XMM7_Da;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  fVar2 = anon_unknown.dwarf_7b54ab::squared(local_54 - local_5c);
  fVar3 = anon_unknown.dwarf_7b54ab::squared(local_58);
  local_68 = sqrtf(fVar2 + fVar3);
  local_6c = (local_68 * 1.0089285 + -(local_54 + local_5c)) * 0.5;
  iVar1 = Res::u(&local_2);
  local_70 = anon_unknown.dwarf_7b54ab::squared(0.5 / (float)iVar1);
  fVar2 = local_38 * 0.25 * local_38;
  local_74 = fVar2;
  fVar3 = PtexUtils::max<float>(local_6c,local_70);
  local_78 = PtexUtils::max<float>(fVar2,fVar3);
  local_54 = local_78 + local_54;
  local_5c = local_78 + local_5c;
  local_7c = sqrtf(((local_54 * local_5c + -(local_58 * 0.25 * local_58)) * 2.0) /
                   (local_54 + local_5c + local_68));
  iVar1 = PtexUtils::calcResFromWidth(local_7c * 2.0);
  local_80 = PtexUtils::max<int>(0,iVar1);
  fVar2 = local_54 * 1.3333334;
  fVar3 = local_58 * 1.1547005 + fVar2;
  local_84 = 0x41440000;
  local_48 = fVar2 * 12.25;
  local_4c = fVar3 * 12.25;
  local_50 = (fVar2 * -0.25 + fVar3 * 0.5 + local_5c) * 12.25;
  fVar2 = sqrtf(local_50);
  local_88 = PtexUtils::min<float>(fVar2,1.0);
  fVar2 = sqrtf(local_48);
  local_8c = PtexUtils::min<float>(fVar2,1.0);
  fVar2 = sqrtf((local_48 - local_4c) + local_50);
  local_90 = PtexUtils::min<float>(fVar2,1.0);
  local_94 = (1.0 - local_1c) - local_20;
  Res::Res(&local_96,(int8_t)local_80,(int8_t)local_80);
  PtexTriangleKernel::set
            (local_18,local_96,local_1c,local_20,local_1c - local_88,local_20 - local_8c,
             local_94 - local_90,local_1c + local_88,local_20 + local_8c,local_94 + local_90,
             local_48,local_4c,local_50);
  return;
}

Assistant:

void PtexTriangleFilter::buildKernel(PtexTriangleKernel& k, float u, float v,
                                     float uw1, float vw1, float uw2, float vw2,
                                     float width, float blur, Res faceRes)
{
    const float sqrt3 = 1.7320508075688772f;

    // compute ellipse coefficients, A*u^2 + B*u*v + C*v^2 == AC - B^2/4
    float scaleAC = 0.25f * width*width;
    float scaleB = -2.0f * scaleAC;
    float A = (vw1*vw1 + vw2*vw2) * scaleAC;
    float B = (uw1*vw1 + uw2*vw2) * scaleB;
    float C = (uw1*uw1 + uw2*uw2) * scaleAC;

    // convert to cartesian domain
    float Ac = 0.75f * A;
    float Bc = float(sqrt3/2) * (B-A);
    float Cc = 0.25f * A - 0.5f * B + C;

    // compute min blur for eccentricity clamping
    const float maxEcc = 15.0f; // max eccentricity
    const float eccRatio = (maxEcc*maxEcc + 1.0f) / (maxEcc*maxEcc - 1.0f);
    float X = sqrtf(squared(Ac - Cc) + squared(Bc));
    float b_e = 0.5f * (eccRatio * X - (Ac + Cc));

    // compute min blur for texel clamping
    // (ensure that ellipse is no smaller than a texel)
    float b_t = squared(0.5f / (float)faceRes.u());

    // add blur
    float b_b = 0.25f * blur * blur;
    float b = PtexUtils::max(b_b, PtexUtils::max(b_e, b_t));
    Ac += b;
    Cc += b;

    // compute minor radius
    float m = sqrtf(2.0f*(Ac*Cc - 0.25f*Bc*Bc) / (Ac + Cc + X));

    // choose desired resolution
    int reslog2 = PtexUtils::max(0, PtexUtils::calcResFromWidth(2.0f*m));

    // convert back to triangular domain
    A = float(4/3.0) * Ac;
    B = float(2/sqrt3) * Bc + A;
    C = -0.25f * A + 0.5f * B + Cc;

    // scale by kernel width
    float scale = PtexTriangleKernelWidth * PtexTriangleKernelWidth;
    A *= scale;
    B *= scale;
    C *= scale;

    // find u,v,w extents
    float uw = PtexUtils::min(sqrtf(C), 1.0f);
    float vw = PtexUtils::min(sqrtf(A), 1.0f);
    float ww = PtexUtils::min(sqrtf(A-B+C), 1.0f);

    // init kernel
    float w = 1.0f - u - v;
    k.set(Res((int8_t)reslog2, (int8_t)reslog2), u, v, u-uw, v-vw, w-ww, u+uw, v+vw, w+ww, A, B, C);
}